

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O2

void __thiscall ser::CentralizedFileFormat::CleanTables(CentralizedFileFormat *this)

{
  string *psVar1;
  string *psVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  ostream *poVar5;
  ostringstream fname;
  char *local_1c8 [4];
  ostringstream local_1a8 [376];
  
  (*(this->super_FileFormat)._vptr_FileFormat[3])();
  cVar3 = FieldsTable::begin_abi_cxx11_((this->super_FileFormat).pFieldsTable_);
  psVar1 = &(this->super_FileFormat).directory_;
  psVar2 = &(this->super_FileFormat).prefix_;
  while( true ) {
    cVar4 = FieldsTable::end_abi_cxx11_((this->super_FileFormat).pFieldsTable_);
    if (cVar3._M_node == cVar4._M_node) break;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar5 = std::operator<<((ostream *)local_1a8,(string *)psVar1);
    poVar5 = std::operator<<(poVar5,"/");
    poVar5 = std::operator<<(poVar5,(string *)psVar2);
    poVar5 = std::operator<<(poVar5,"_");
    poVar5 = std::operator<<(poVar5,(string *)(cVar3._M_node + 2));
    std::operator<<(poVar5,".dat");
    std::__cxx11::stringbuf::str();
    remove(local_1c8[0]);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar5 = std::operator<<((ostream *)local_1a8,(string *)psVar1);
  poVar5 = std::operator<<(poVar5,"/");
  poVar5 = std::operator<<(poVar5,(string *)psVar2);
  std::operator<<(poVar5,".dat");
  std::__cxx11::stringbuf::str();
  remove(local_1c8[0]);
  std::__cxx11::string::~string((string *)local_1c8);
  MetainfoSet::Cleanup((this->super_FileFormat).pGlobalMetainfo_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
           *)(this->super_FileFormat).pFieldsTable_);
  OffsetTable::Cleanup((this->super_FileFormat).pOffsetTable_);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void CentralizedFileFormat::CleanTables()
{
    // Import tables to get list of files
    ImportTables();

    // Remove data files
    for (FieldsTable::const_iterator iter = pFieldsTable_->begin(); iter != pFieldsTable_->end(); ++iter)
    {
        std::ostringstream fname;
        fname << directory_ << "/" << prefix_ << "_" << iter->second.name() << ".dat";
        std::remove(fname.str().c_str());
    }

    // Remove database file
    std::ostringstream fname;
    fname << directory_ << "/" << prefix_ << ".dat";
    std::remove(fname.str().c_str());

    // Clean tables
    pGlobalMetainfo_->Cleanup();
    pFieldsTable_->Cleanup();
    pOffsetTable_->Cleanup();
}